

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O0

void test_null(void)

{
  int iVar1;
  VALUE_TYPE VVar2;
  VALUE v;
  VALUE_TYPE in_stack_00000044;
  VALUE *in_stack_00000048;
  VALUE *in_stack_fffffffffffffff0;
  
  memset(&stack0xfffffffffffffff0,0,0x10);
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3b,"%s","value_is_compatible(NULL, VALUE_NULL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3c,"%s","!value_is_compatible(NULL, VALUE_BOOL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3d,"%s","!value_is_compatible(NULL, VALUE_INT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3e,"%s","!value_is_compatible(NULL, VALUE_UINT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f,"%s","!value_is_compatible(NULL, VALUE_INT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x40,"%s","!value_is_compatible(NULL, VALUE_UINT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x41,"%s","!value_is_compatible(NULL, VALUE_FLOAT)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x42,"%s","!value_is_compatible(NULL, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x43,"%s","!value_is_compatible(NULL, VALUE_ARRAY)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x44,"%s","!value_is_compatible(NULL, VALUE_DICT)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x46,"%s","value_is_compatible(&v, VALUE_NULL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x47,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x48,"%s","!value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x49,"%s","!value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x4a,"%s","!value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x4b,"%s","!value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x4c,"%s","!value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x4d,"%s","!value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x4e,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x4f,"%s","!value_is_compatible(&v, VALUE_DICT)");
  VVar2 = value_type((VALUE *)&stack0xfffffffffffffff0);
  acutest_check_((int)(ulong)(VVar2 == VALUE_NULL),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x51,"%s","value_type(&v) == VALUE_NULL");
  iVar1 = value_is_new(in_stack_fffffffffffffff0);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x52,"%s","!value_is_new(&v)");
  memset(&stack0xfffffffffffffff0,0xff,0x10);
  value_init_null((VALUE *)&stack0xfffffffffffffff0);
  VVar2 = value_type((VALUE *)&stack0xfffffffffffffff0);
  acutest_check_((int)(ulong)(VVar2 == VALUE_NULL),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x57,"%s","value_type(&v) == VALUE_NULL");
  iVar1 = value_is_new(in_stack_fffffffffffffff0);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x58,"%s","!value_is_new(&v)");
  value_fini((VALUE *)0x104f39);
  return;
}

Assistant:

static void
test_null(void)
{
    VALUE v = VALUE_NULL_INITIALIZER;

    TEST_CHECK(value_is_compatible(NULL, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_BOOL));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_UINT32));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_INT64));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_UINT64));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_FLOAT));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_DICT));

    TEST_CHECK(value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(!value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(!value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));

    TEST_CHECK(value_type(&v) == VALUE_NULL);
    TEST_CHECK(!value_is_new(&v));

    memset(&v, 0xff, sizeof(VALUE));

    value_init_null(&v);
    TEST_CHECK(value_type(&v) == VALUE_NULL);
    TEST_CHECK(!value_is_new(&v));
    value_fini(&v);
}